

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAxis2Placement2D::IfcAxis2Placement2D(IfcAxis2Placement2D *this)

{
  IfcAxis2Placement2D *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x58,"IfcAxis2Placement2D");
  IfcPlacement::IfcPlacement(&this->super_IfcPlacement,&PTR_construction_vtable_24__00e82488);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D,_1UL> *)
             &(this->super_IfcPlacement).field_0x38,&PTR_construction_vtable_24__00e82500);
  (this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xe823d0;
  *(undefined8 *)&this->field_0x58 = 0xe82470;
  *(undefined8 *)
   &(this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xe823f8;
  *(undefined8 *)
   &(this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xe82420;
  *(undefined8 *)&(this->super_IfcPlacement).field_0x38 = 0xe82448;
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
             &(this->super_IfcPlacement).field_0x48);
  return;
}

Assistant:

IfcAxis2Placement2D() : Object("IfcAxis2Placement2D") {}